

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong uVar2;
  ulong *puVar3;
  undefined4 uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan> *this;
  undefined1 uVar9;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar10;
  undefined8 uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  Vector *pVVar13;
  STORAGE_TYPE *pSVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  idx_t iVar16;
  idx_t iVar17;
  ulong uVar18;
  char **ppcVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  string_t sVar23;
  UnifiedVectorFormat state_format;
  ulong local_c8;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  Vector *local_a8;
  ulong local_a0;
  Vector *local_98;
  long local_90;
  idx_t local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_88 = offset;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  local_c8 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar20 = 0;
  }
  else {
    lVar20 = 0;
    iVar16 = 0;
    do {
      iVar17 = iVar16;
      if (*local_78 != 0) {
        iVar17 = (idx_t)*(uint *)(*local_78 + iVar16 * 4);
      }
      lVar20 = lVar20 + *(long *)(*(long *)(local_70 + iVar17 * 8) + 0x10);
      iVar16 = iVar16 + 1;
    } while (count != iVar16);
  }
  duckdb::ListVector::Reserve(result,lVar20 + local_c8);
  local_90 = *(long *)(result + 0x20);
  pVVar13 = (Vector *)duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    local_98 = result + 0x30;
    uVar18 = 0;
    local_a8 = result;
    local_a0 = count;
    do {
      uVar21 = uVar18;
      if (*local_78 != 0) {
        uVar21 = (ulong)*(uint *)(*local_78 + uVar18 * 4);
      }
      uVar2 = uVar18 + local_88;
      this = *(BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan> **)
              (local_70 + uVar21 * 8);
      if (((char)this[1].capacity == '\x01') && (iVar16 = this->size, iVar16 != 0)) {
        *(ulong *)(local_90 + uVar2 * 0x10) = local_c8;
        *(idx_t *)(local_90 + 8 + uVar2 * 0x10) = iVar16;
        pSVar14 = BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan>::
                  SortAndGetHeap(this);
        if (this->size != 0) {
          ppcVar19 = &(pSVar14->second).value.value.pointer.ptr;
          lVar20 = local_c8 << 4;
          uVar21 = 0;
          do {
            paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar19 + -1);
            uVar4 = paVar1->length;
            uVar6 = paVar1->prefix[0];
            uVar7 = paVar1->prefix[1];
            uVar8 = paVar1->prefix[2];
            uVar9 = paVar1->prefix[3];
            sVar23.value.pointer.prefix[3] = uVar9;
            sVar23.value.pointer.prefix[2] = uVar8;
            sVar23.value.pointer.prefix[1] = uVar7;
            sVar23.value.pointer.prefix[0] = uVar6;
            sVar23.value.pointer.length = uVar4;
            sVar23.value.pointer.ptr = *ppcVar19;
            auVar22 = duckdb::StringVector::AddStringOrBlob(pVVar13,sVar23);
            lVar5 = *(long *)(pVVar13 + 0x20);
            *(long *)(lVar5 + lVar20) = auVar22._0_8_;
            *(long *)(lVar5 + 8 + lVar20) = auVar22._8_8_;
            uVar21 = uVar21 + 1;
            ppcVar19 = ppcVar19 + 8;
            lVar20 = lVar20 + 0x10;
          } while (uVar21 < this->size);
          local_c8 = local_c8 + uVar21;
          result = local_a8;
          count = local_a0;
        }
      }
      else {
        if (*(long *)(result + 0x28) == 0) {
          local_80 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var12 = p_Stack_b0;
          uVar11 = local_b8;
          local_b8 = 0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar11;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var12;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               local_98);
          *(unsigned_long **)(result + 0x28) =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar10 = (byte)uVar2 & 0x3f;
        puVar3 = (ulong *)(*(long *)(result + 0x28) + (uVar2 >> 6) * 8);
        *puVar3 = *puVar3 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != count);
  }
  duckdb::ListVector::SetListSize(result,local_c8);
  duckdb::Vector::Verify((ulong)result);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}